

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalGenerator::IsExportedTargetsFile(cmGlobalGenerator *this,string *filename)

{
  const_iterator cVar1;
  bool bVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
          ::find(&(this->BuildExportSets)._M_t,filename);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = false;
  }
  else {
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
            ::find(&(this->BuildExportExportSets)._M_t,filename);
    bVar2 = (_Rb_tree_header *)cVar1._M_node ==
            &(this->BuildExportExportSets)._M_t._M_impl.super__Rb_tree_header;
  }
  return bVar2;
}

Assistant:

bool
cmGlobalGenerator::IsExportedTargetsFile(const std::string &filename) const
{
  const std::map<std::string, cmExportBuildFileGenerator*>::const_iterator it
                                      = this->BuildExportSets.find(filename);
  if (it == this->BuildExportSets.end())
    {
    return false;
    }
  return this->BuildExportExportSets.find(filename)
                                        == this->BuildExportExportSets.end();
}